

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
* __thiscall
deqp::gls::BuiltinPrecisionTests::BuiltinFuncs::getFactories
          (vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
           *__return_storage_ptr__,BuiltinFuncs *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference this_00;
  CaseFactory *local_30;
  ulong local_28;
  size_t ndx;
  BuiltinFuncs *local_18;
  BuiltinFuncs *this_local;
  vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
  *ret;
  
  ndx._7_1_ = 0;
  local_18 = this;
  this_local = (BuiltinFuncs *)__return_storage_ptr__;
  std::
  vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
  ::vector(__return_storage_ptr__);
  for (local_28 = 0; uVar1 = local_28,
      sVar2 = std::
              vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
              ::size(&this->m_factories), uVar1 < sVar2; local_28 = local_28 + 1) {
    this_00 = std::
              vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
              ::operator[](&this->m_factories,local_28);
    local_30 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::get(this_00);
    std::
    vector<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::CaseFactory_*>_>
    ::push_back(__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<const CaseFactory*>	getFactories	(void) const
	{
		vector<const CaseFactory*> ret;

		for (size_t ndx = 0; ndx < m_factories.size(); ++ndx)
			ret.push_back(m_factories[ndx].get());

		return ret;
	}